

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,(unsigned_char)2>(Thread *this)

{
  difference_type __n;
  ulong uVar1;
  long lVar2;
  Simd<unsigned_long,_(unsigned_char)__x02_> val;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  uVar1 = 0;
  lVar2 = 0;
  do {
    uVar1 = (uVar1 + 1) - (ulong)(*(long *)((long)&local_18 + lVar2) == 0);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  Push(this,(Value)ZEXT116(1 < uVar1));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}